

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *in_RCX;
  Mat *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar1;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  int in_stack_fffffffffffffe34;
  Mat *in_stack_fffffffffffffe38;
  Mat *pMVar2;
  uint7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  Mat *in_stack_fffffffffffffe48;
  int _elempack;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  void *local_148;
  size_t sStack_140;
  size_t sStack_138;
  undefined8 uStack_130;
  Allocator *local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  Mat local_108;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  int local_ac;
  Mat *local_a8;
  Mat *local_a0;
  int local_84;
  Mat *local_80;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  Mat *local_50;
  Mat *local_48;
  Mat *local_38;
  void *local_30;
  Mat *local_20;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_ac = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  _elempack = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_a8 = in_RCX;
  local_a0 = in_RDX;
  if ((*(int *)(in_RSI + 5) == 2) && (*(int *)((long)in_RSI + 0x2c) == local_ac)) {
    local_b0 = *(undefined4 *)(in_RSI + 6);
    local_b8 = in_RSI[2];
    local_bc = *(undefined4 *)(in_RSI + 3);
    Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),_elempack,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_48 = local_a0;
    bVar1 = true;
    if (local_a0->data != (void *)0x0) {
      local_20 = local_a0;
      bVar1 = local_a0->cstep * (long)local_a0->c == 0;
    }
    if (bVar1) {
      local_84 = -100;
    }
    else {
      innerproduct_gemm_fp16s_sse
                ((Mat *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48,
                 (Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,local_a8,
                 (Option *)in_stack_fffffffffffffe60);
      local_84 = 0;
    }
  }
  else {
    pMVar2 = &local_108;
    local_108.data = (void *)*in_RSI;
    local_108.refcount = (int *)in_RSI[1];
    local_108.allocator = (Allocator *)in_RSI[4];
    local_108.dims = *(int *)(in_RSI + 5);
    local_108.w = *(int *)((long)in_RSI + 0x2c);
    local_108.h = *(int *)(in_RSI + 6);
    local_108.d = *(int *)((long)in_RSI + 0x34);
    local_108.c = *(int *)(in_RSI + 7);
    local_108.cstep = in_RSI[8];
    if (local_108.refcount != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + 1;
      UNLOCK();
    }
    local_38 = pMVar2;
    local_8 = pMVar2;
    if (*(int *)(in_RSI + 5) != 1) {
      local_148 = in_RCX->data;
      sStack_138 = in_RCX->elemsize;
      uStack_130 = *(undefined8 *)&in_RCX->elempack;
      local_128 = in_RCX->allocator;
      uStack_120._0_4_ = in_RCX->dims;
      uStack_120._4_4_ = in_RCX->w;
      uStack_118._0_4_ = in_RCX->h;
      uStack_118._4_4_ = in_RCX->d;
      uStack_110 = *(undefined8 *)&in_RCX->c;
      sStack_140 = in_RCX->elemsize;
      (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],in_RSI,&local_108,&local_148);
    }
    if (((ulong)local_a8->allocator & 0x100000000000000) != 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
        in_stack_fffffffffffffe54 = 8;
      }
      else {
        in_stack_fffffffffffffe54 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          in_stack_fffffffffffffe54 = 4;
        }
      }
    }
    Mat::create(pMVar2,in_stack_fffffffffffffe5c,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),_elempack,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_50 = local_a0;
    uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe50);
    if (local_a0->data != (void *)0x0) {
      local_18 = local_a0;
      uVar3 = CONCAT13(local_a0->cstep * (long)local_a0->c == 0,(int3)in_stack_fffffffffffffe50);
    }
    if ((char)((uint)uVar3 >> 0x18) == '\0') {
      innerproduct_fp16s_sse
                ((Mat *)CONCAT44(in_stack_fffffffffffffe54,uVar3),local_a0,
                 (Mat *)(ulong)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe34,local_a8,(Option *)pMVar2);
      local_84 = 0;
    }
    else {
      local_84 = -100;
    }
    pMVar2 = &local_108;
    if (local_108.refcount != (int *)0x0) {
      local_5c = 0xffffffff;
      LOCK();
      local_60 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if (local_60 == 1) {
        local_80 = pMVar2;
        local_58 = pMVar2;
        if (local_108.allocator == (Allocator *)0x0) {
          local_30 = local_108.data;
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])(local_108.allocator,local_108.data);
        }
      }
    }
    pMVar2->data = (void *)0x0;
    pMVar2->elemsize = 0;
    pMVar2->elempack = 0;
    pMVar2->dims = 0;
    pMVar2->w = 0;
    pMVar2->h = 0;
    pMVar2->d = 0;
    pMVar2->c = 0;
    pMVar2->cstep = 0;
    pMVar2->refcount = (int *)0x0;
  }
  return local_84;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}